

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O3

NumberParseMatcher * __thiscall
icu_63::numparse::impl::AffixTokenMatcherWarehouse::plusSign(AffixTokenMatcherWarehouse *this)

{
  UnicodeString *src;
  PlusSignMatcher local_78;
  
  PlusSignMatcher::PlusSignMatcher(&local_78,this->fSetupData->dfs,true);
  src = &local_78.super_SymbolMatcher.fString;
  UnicodeString::moveFrom(&(this->fPlusSign).super_SymbolMatcher.fString,src);
  (this->fPlusSign).super_SymbolMatcher.fUniSet = local_78.super_SymbolMatcher.fUniSet;
  (this->fPlusSign).fAllowTrailing = local_78.fAllowTrailing;
  local_78.super_SymbolMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__SymbolMatcher_003b53b8;
  UnicodeString::~UnicodeString(src);
  NumberParseMatcher::~NumberParseMatcher((NumberParseMatcher *)&local_78);
  return (NumberParseMatcher *)&this->fPlusSign;
}

Assistant:

NumberParseMatcher& AffixTokenMatcherWarehouse::plusSign() {
    return fPlusSign = {fSetupData->dfs, true};
}